

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readBackgroundMatrices.hpp
# Opt level: O3

vector<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>,_std::allocator<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>_>_>
* __thiscall
njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::BackgroundChannels::
readBackgroundMatrices<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (vector<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>,_std::allocator<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>_>_>
           *__return_storage_ptr__,BackgroundChannels *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT,int NCH,int KBK)

{
  pointer poVar1;
  undefined8 *puVar2;
  variant<njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::NoBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::SammyBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::FrohnerBackgroundRMatrix>
  *this_00;
  char *args;
  int MAT_00;
  int args_1;
  long line;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  temp;
  ControlRecord cont;
  char *local_1a8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  ControlRecord local_198;
  _Storage<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>,_false>
  local_168;
  char local_38;
  
  MAT_00 = (int)lineNumber;
  local_38 = '\0';
  std::
  vector<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>,_std::allocator<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>_>_>
  ::vector(__return_storage_ptr__,(long)MT,(value_type *)&local_168._M_value,
           (allocator_type *)&local_198);
  if (local_38 == '\x01') {
    local_38 = '\0';
    std::__detail::__variant::
    _Variant_storage<false,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>
    ::~_Variant_storage((_Variant_storage<false,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>
                         *)&local_168._M_value);
  }
  if ((NCH < 0) || (MT < NCH)) {
    tools::Log::error<char_const*>("Encountered illegal KBK value");
    tools::Log::info<char_const*>("KBK must be between zero and NCH");
    tools::Log::info<char_const*,int>("NCH value: {}",MT);
    tools::Log::info<char_const*,int>("KBK value: {}",NCH);
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = getenv;
    __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
  }
  if (NCH != 0) {
    do {
      local_1a0._M_current = *(char **)this;
      local_1a8 = end->_M_current;
      ControlRecord::ControlRecord<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                (&local_198,&local_1a0,begin,(long *)&local_1a8,MAT_00,MAT,MF);
      args_1 = (int)local_198.
                    super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                    .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                    super__Tuple_impl<2UL,_long,_long,_long,_long>.
                    super__Head_base<2UL,_long,_false>._M_head_impl;
      if ((args_1 < 1) || (MT < args_1)) {
        tools::Log::error<char_const*>("Encountered illegal LCH value");
        tools::Log::info<char_const*>("LCH must be between 1 and NCH");
        tools::Log::info<char_const*,int>("NCH value: {}",MT);
        args = "LCH value: {}";
LAB_0012a914:
        tools::Log::info<char_const*,int>(args,args_1);
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = getenv;
        __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
      }
      switch((int)local_198.
                  super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                  .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<2UL,_long,_long,_long,_long>.
                  super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
                  _M_head_impl) {
      case 0:
        NoBackgroundRMatrix::
        NoBackgroundRMatrix<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((NoBackgroundRMatrix *)&local_168._M_value,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)this,begin,(long *)end,MAT_00,MAT,MF);
        poVar1 = (__return_storage_ptr__->
                 super__Vector_base<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>,_std::allocator<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        this_00 = (variant<njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::NoBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::SammyBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::FrohnerBackgroundRMatrix>
                   *)(poVar1 + (args_1 - 1U));
        if (*(bool *)((long)&poVar1[args_1 - 1U].
                             super__Optional_base<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>,_true,_false,_false>
                     + 0x130) == true) {
          std::
          variant<njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::NoBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::SammyBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::FrohnerBackgroundRMatrix>
          ::operator=(this_00,(NoBackgroundRMatrix *)&local_168._M_value);
        }
        else {
          *(undefined4 *)this_00 = local_168._0_4_;
          this_00[0x128] =
               (variant<njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::NoBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::SammyBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::FrohnerBackgroundRMatrix>
                )0x0;
LAB_0012a897:
          this_00[0x130] =
               (variant<njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::NoBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::SammyBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::FrohnerBackgroundRMatrix>
                )0x1;
        }
        break;
      case 1:
        TabulatedBackgroundRMatrix::
        TabulatedBackgroundRMatrix<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((TabulatedBackgroundRMatrix *)&local_168._M_value,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)this,begin,(long *)end,MAT_00,MAT,MF);
        std::
        optional<std::variant<njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::NoBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::SammyBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::FrohnerBackgroundRMatrix>>
        ::operator=((optional<std::variant<njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::NoBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::SammyBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::FrohnerBackgroundRMatrix>>
                     *)((__return_storage_ptr__->
                        super__Vector_base<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>,_std::allocator<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + (args_1 - 1)),
                    (TabulatedBackgroundRMatrix *)&local_168._M_value);
        Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix::~TabulatedBackgroundRMatrix
                  ((TabulatedBackgroundRMatrix *)&local_168._M_value);
        break;
      case 2:
        SammyBackgroundRMatrix::
        SammyBackgroundRMatrix<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((SammyBackgroundRMatrix *)&local_168._M_value,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)this,begin,(long *)end,MAT_00,MAT,MF);
        poVar1 = (__return_storage_ptr__->
                 super__Vector_base<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>,_std::allocator<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        this_00 = (variant<njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::NoBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::SammyBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::FrohnerBackgroundRMatrix>
                   *)(poVar1 + (args_1 - 1U));
        if (*(bool *)((long)&poVar1[args_1 - 1U].
                             super__Optional_base<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>,_true,_false,_false>
                     + 0x130) != true) {
          *(undefined8 *)(this_00 + 0x30) = local_168._48_8_;
          *(undefined8 *)(this_00 + 0x38) = local_168._56_8_;
          *(undefined8 *)(this_00 + 0x20) = local_168._32_8_;
          *(undefined8 *)(this_00 + 0x28) = local_168._40_8_;
          *(undefined8 *)(this_00 + 0x10) = local_168._16_8_;
          *(undefined8 *)(this_00 + 0x18) = local_168._24_8_;
          *(ulong *)this_00 = CONCAT44(local_168._4_4_,local_168._0_4_);
          *(undefined8 *)(this_00 + 8) = local_168._8_8_;
          this_00[0x128] =
               (variant<njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::NoBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::SammyBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::FrohnerBackgroundRMatrix>
                )0x2;
          goto LAB_0012a897;
        }
        std::
        variant<njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::NoBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::SammyBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::FrohnerBackgroundRMatrix>
        ::operator=(this_00,(SammyBackgroundRMatrix *)&local_168._M_value);
        break;
      case 3:
        FrohnerBackgroundRMatrix::
        FrohnerBackgroundRMatrix<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((FrohnerBackgroundRMatrix *)&local_168._M_value,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)this,begin,(long *)end,MAT_00,MAT,MF);
        poVar1 = (__return_storage_ptr__->
                 super__Vector_base<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>,_std::allocator<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        this_00 = (variant<njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::NoBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::SammyBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::FrohnerBackgroundRMatrix>
                   *)(poVar1 + (args_1 - 1U));
        if (*(bool *)((long)&poVar1[args_1 - 1U].
                             super__Optional_base<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>,_true,_false,_false>
                     + 0x130) != true) {
          *(undefined8 *)(this_00 + 0x20) = local_168._32_8_;
          *(undefined8 *)(this_00 + 0x28) = local_168._40_8_;
          *(undefined8 *)(this_00 + 0x10) = local_168._16_8_;
          *(undefined8 *)(this_00 + 0x18) = local_168._24_8_;
          *(ulong *)this_00 = CONCAT44(local_168._4_4_,local_168._0_4_);
          *(undefined8 *)(this_00 + 8) = local_168._8_8_;
          this_00[0x128] =
               (variant<njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::NoBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::SammyBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::FrohnerBackgroundRMatrix>
                )0x3;
          goto LAB_0012a897;
        }
        std::
        variant<njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::NoBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::SammyBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::FrohnerBackgroundRMatrix>
        ::operator=(this_00,(FrohnerBackgroundRMatrix *)&local_168._M_value);
        break;
      default:
        tools::Log::error<char_const*>("Encountered illegal LBK value");
        tools::Log::info<char_const*>("LBK must be between 0 and 3");
        args = "LBK value: {}";
        args_1 = (int)local_198.
                      super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                      .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                      super__Tuple_impl<2UL,_long,_long,_long,_long>.
                      super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
                      _M_head_impl;
        goto LAB_0012a914;
      }
      NCH = NCH + -1;
    } while (NCH != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector< std::optional< BackgroundRMatrix > >
readBackgroundMatrices( Iterator& begin, const Iterator& end, long& lineNumber,
                        int MAT, int MF, int MT,
                        int NCH, int KBK ) {

  std::vector< std::optional< BackgroundRMatrix > >
  background( NCH, std::nullopt );

  if ( ( KBK < 0 ) || ( KBK > NCH ) ) {

    Log::error( "Encountered illegal KBK value" );
    Log::info( "KBK must be between zero and NCH" );
    Log::info( "NCH value: {}", NCH );
    Log::info( "KBK value: {}", KBK );
    throw std::exception();
  }

  while( KBK-- ) {

    Iterator temp = begin;
    long line = lineNumber;
    ControlRecord cont( temp, end, line, MAT, MF, MT );
    int LCH = cont.L1();
    int LBK = cont.L2();

    if ( ( LCH <= 0 ) || ( LCH > NCH ) ) {

      Log::error( "Encountered illegal LCH value" );
      Log::info( "LCH must be between 1 and NCH" );
      Log::info( "NCH value: {}", NCH );
      Log::info( "LCH value: {}", LCH );
      throw std::exception();
    }

    switch ( LBK ) {

      case 0 : {

        background[ LCH - 1 ] =
            NoBackgroundRMatrix( begin, end, lineNumber, MAT, MF, MT );
        break;
      }
      case 1 : {

        background[ LCH - 1 ] =
            TabulatedBackgroundRMatrix( begin, end, lineNumber, MAT, MF, MT );
        break;
      }
      case 2 : {

        background[ LCH - 1 ] =
            SammyBackgroundRMatrix( begin, end, lineNumber, MAT, MF, MT );
        break;
      }
      case 3 : {

        background[ LCH - 1 ] =
            FrohnerBackgroundRMatrix( begin, end, lineNumber, MAT, MF, MT );
        break;
      }
      default : {

        Log::error( "Encountered illegal LBK value" );
        Log::info( "LBK must be between 0 and 3" );
        Log::info( "LBK value: {}", LBK );
        throw std::exception();
      }
    }
  }
  return background;
}